

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O1

void __thiscall
aeron::concurrent::AtomicBuffer::boundsCheck(AtomicBuffer *this,index_t index,uint64_t length)

{
  SourcedException *this_00;
  char *pcVar1;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  if ((-1 < index) && (length <= (ulong)this->m_length - (ulong)(uint)index)) {
    return;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  util::strPrintf_abi_cxx11_
            (&local_40,"index out of bounds[%p]: index=%lld + %lld, capacity=%lld",this,(long)index,
             length,(ulong)this->m_length);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "void aeron::concurrent::AtomicBuffer::boundsCheck(util::index_t, std::uint64_t) const"
             ,"");
  pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/AtomicBuffer.h"
                            );
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_81);
  util::SourcedException::SourcedException(this_00,&local_40,&local_80,&local_60,0x1cd);
  *(undefined ***)this_00 = &PTR__SourcedException_001628e8;
  __cxa_throw(this_00,&util::OutOfBoundsException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void boundsCheck(util::index_t index, std::uint64_t length) const
    {
#if !defined(DISABLE_BOUNDS_CHECKS)
        if (AERON_COND_EXPECT(index < 0 || (static_cast<std::uint64_t>(m_length) - index) < length, false))
        {
            throw aeron::util::OutOfBoundsException(
                aeron::util::strPrintf(
                    "index out of bounds[%p]: index=%lld + %lld, capacity=%lld",
                    this, static_cast<long long>(index), length, static_cast<long long>(m_length)),
                SOURCEINFO);
        }
#endif
    }